

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::UniformStructTests::init(UniformStructTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  LineStream *pLVar2;
  ShaderStructCase *pSVar3;
  undefined1 local_1c8 [384];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"basic_vertex","Basic struct usage",true,0,
                            init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_basic::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"basic_fragment","Basic struct usage",false,0,
                            init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_basic::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_vertex","Nested struct",true,0,
                            init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_fragment","Nested struct",false,0,
                            init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"array_member_vertex","Struct with array member",true,0,
                            init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_array_member::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"array_member_fragment","Struct with array member",false,0,
                            init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_array_member::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"array_member_dynamic_index_vertex",
                            "Struct with array member, dynamic indexing",true,4,
                            init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"array_member_dynamic_index_fragment",
                            "Struct with array member, dynamic indexing",false,4,
                            init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"struct_array_vertex","Struct array",true,0,
                            init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"struct_array_fragment","Struct array",false,0,
                            init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"struct_array_dynamic_index_vertex",
                            "Struct array with dynamic indexing",true,4,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"struct_array_dynamic_index_fragment",
                            "Struct array with dynamic indexing",false,4,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(r, g, b, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_struct_array_vertex","Nested struct array",true,0,
                            init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(r, g, b, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_struct_array_fragment","Nested struct array",false,0,
                            init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(r, g, b, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_struct_array_dynamic_index_vertex",
                            "Nested struct array with dynamic indexing",true,4,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(r, g, b, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"nested_struct_array_dynamic_index_fragment",
                            "Nested struct array with dynamic indexing",false,4,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float rgb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint alpha = 0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < 3; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\trgb[i] = s[2-i].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\talpha += s[i].b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"loop_struct_array_vertex","Struct array usage in loop",true,0,
                            init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float rgb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint alpha = 0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < 3; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\trgb[i] = s[2-i].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\talpha += s[i].b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"loop_struct_array_fragment","Struct array usage in loop",false,0
                            ,init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_four;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_half;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_third;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_fourth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_sixth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float a = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < 2; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\tfor (int j = 0; j < 3; j++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\ta *= s[i].b[j].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"loop_nested_struct_array_vertex",
                            "Nested struct array usage in loop",true,0,
                            init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_four;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_half;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_third;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_fourth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_sixth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float a = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < 2; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\tfor (int j = 0; j < 3; j++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\ta *= s[i].b[j].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"loop_nested_struct_array_fragment",
                            "Nested struct array usage in loop",false,0,
                            init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float rgb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint alpha = 0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\trgb[i] = s[2-i].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\talpha += s[i].b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"dynamic_loop_struct_array_vertex",
                            "Struct array usage in dynamic loop",true,6,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float rgb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint alpha = 0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < ui_three; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\trgb[i] = s[2-i].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\talpha += s[i].b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"dynamic_loop_struct_array_fragment",
                            "Struct array usage in dynamic loop",false,6,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_four;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_half;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_third;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_fourth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_sixth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float a = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < ui_two; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\tfor (int j = 0; j < ui_three; j++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\ta *= s[i].b[j].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"dynamic_loop_nested_struct_array_vertex",
                            "Nested struct array usage in dynamic loop",true,6,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_three;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_four;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_half;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_third;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_fourth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_sixth;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb[3];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float a = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tfor (int i = 0; i < ui_two; i++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\tfor (int j = 0; j < ui_three; j++)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tr += s[0].b[j].b[i].y;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tg += s[i].b[j].b[0].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\tb += s[i].b[j].b[1].x;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t\ta *= s[i].b[j].a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t\t}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t}");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"dynamic_loop_nested_struct_array_fragment",
                            "Nested struct array usage in dynamic loop",false,6,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_vertex","Sampler in struct",true,1,
                            init()::Eval_sampler::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_fragment","Sampler in struct",false,1,
                            init()::Eval_sampler::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_nested_vertex","Sampler in nested struct",true,1,
                            init()::Eval_sampler_nested::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_zero;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct T {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec2\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tT\t\t\t\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_nested_fragment","Sampler in nested struct",false,1,
                            init()::Eval_sampler_nested::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_array_vertex","Sampler in struct array",true,1,
                            init()::Eval_sampler_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tsampler2D\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S s[2];");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,
                      "\t${DST} = vec4(texture2D(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                     );
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"sampler_array_fragment","Sampler in struct array",false,1,
                            init()::Eval_sampler_array::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_sampler_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S c;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"equal_vertex","Struct equality",true,0,
                            init()::Eval_equal::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_equal::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S c;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == b) ${DST}.x = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == c) ${DST}.y = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a == d) ${DST}.z = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"equal_fragment","Struct equality",false,0,
                            init()::Eval_equal::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_equal::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S c;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"not_equal_vertex","Struct equality",true,0,
                            init()::Eval_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_not_equal::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 8));
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_1c8._0_4_ = 0;
  local_48._M_p = (pointer)&local_38;
  pLVar2 = deqp::gls::LineStream::operator<<((LineStream *)local_1c8,"${DECLARATIONS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform mediump float uf_one;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform int ui_two;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"struct S {");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float\ta;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump vec3\tb;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tint\t\t\t\tc;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"};");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S a;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S b;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"uniform S c;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,glcts::fixed_sample_locations_values + 1);
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"void main (void)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != b) ${DST}.x = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != c) ${DST}.y = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (a != d) ${DST}.z = 1.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\t${ASSIGN_POS}");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pSVar3 = createStructCase(pCVar1,"not_equal_fragment","Struct equality",false,0,
                            init()::Eval_not_equal::eval(deqp::gls::ShaderEvalContext__,
                            init()::SetUniforms_not_equal::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  deqp::gls::LineStream::~LineStream((LineStream *)local_1c8);
  return extraout_EAX;
}

Assistant:

void UniformStructTests::init (void)
{
	#define UNIFORM_STRUCT_CASE(NAME, DESCRIPTION, FLAGS, SHADER_SRC, SET_UNIFORMS_BODY, EVAL_FUNC_BODY)																\
		do {																																							\
			struct SetUniforms_##NAME {																																	\
				 static void setUniforms (const glw::Functions& gl, deUint32 programID, const tcu::Vec4& constCoords) SET_UNIFORMS_BODY /* NOLINT(SET_UNIFORMS_BODY) */ \
			}